

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# metatype_create.cpp
# Opt level: O1

metatype * mpt::metatype::create(char *val,int len)

{
  size_t sVar1;
  metatype *pmVar2;
  metatype *pmVar3;
  ssize_t sVar4;
  encode_array *this;
  
  if (len < 0) {
    if (val == (char *)0x0) {
      len = 0;
    }
    else {
      sVar1 = strlen(val);
      len = (int)sVar1;
    }
  }
  if ((len < 0xff && val != (char *)0x0) &&
     (pmVar2 = &basic::create(val,len)->super_metatype, pmVar2 != (metatype *)0x0)) {
    return pmVar2;
  }
  pmVar3 = io::buffer::metatype::create((array *)0x0);
  if (pmVar3 != (metatype *)0x0 && val != (char *)0x0) {
    if ((len != 0) &&
       (sVar4 = encode_array::push(&(pmVar3->super_buffer).super_encode_array,(long)len,val),
       sVar4 < 0)) {
      (*(pmVar3->super_metatype).super_convertable._vptr_convertable[1])(pmVar3);
      return (metatype *)0x0;
    }
    this = &(pmVar3->super_buffer).super_encode_array;
    encode_array::push(this,1,"");
    encode_array::push(this,0,(void *)0x0);
  }
  return &pmVar3->super_metatype;
}

Assistant:

metatype *metatype::create(const char *val, int len)
{
	if (len < 0) {
		len = val ? strlen(val) : 0;
	}
	// compatible small generic metatype
	if (val && len < std::numeric_limits<uint8_t>::max()) {
		metatype *m = metatype::basic::create(val, len);
		if (m) {
			return m;
		}
	}
	// create buffer-backed text metatype
	io::buffer::metatype *b;
	if ((b = mpt::io::buffer::metatype::create(0))
	 && val) {
		if (len && b->push(len, val) < 0) {
			b->unref();
			return 0;
		}
		b->push(1, "\0"); // terminate string
		b->push(0, 0);    // mark content finished
	}
	return b;
}